

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

LY_ERR ly_path_append(ly_ctx *ctx,ly_path *src,ly_path **dst)

{
  ly_path *plVar1;
  ly_path_predicate *plVar2;
  int iVar3;
  LY_ERR LVar4;
  long *plVar5;
  undefined8 *puVar6;
  ly_path_predicate **pplVar7;
  ly_path_predicate *plVar8;
  
  if (src != (ly_path *)0x0) {
    plVar1 = *dst;
    if (plVar1 == (ly_path *)0x0) {
      plVar5 = (long *)calloc(1,(long)src[-1].predicates * 0x18 + 8);
    }
    else {
      plVar5 = (long *)realloc(&plVar1[-1].predicates,
                               ((long)&(plVar1[-1].predicates)->type +
                               (long)&(src[-1].predicates)->type) * 0x18 + 8);
    }
    if (plVar5 == (long *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_append");
      return LY_EMEM;
    }
    *dst = (ly_path *)(plVar5 + 1);
    plVar8 = src[-1].predicates;
    memset(plVar5 + *plVar5 * 3 + 1,0,(long)plVar8 * 0x18);
    if (plVar8 == (ly_path_predicate *)0x0) {
      return LY_SUCCESS;
    }
    pplVar7 = &src->predicates;
    plVar8 = (ly_path_predicate *)0x0;
    do {
      plVar1 = *dst;
      if (plVar1 == (ly_path *)0x0) {
        puVar6 = (undefined8 *)malloc(0x20);
        if (puVar6 == (undefined8 *)0x0) goto LAB_001162d6;
        *puVar6 = 1;
LAB_001162c9:
        *dst = (ly_path *)(puVar6 + 1);
        LVar4 = LY_SUCCESS;
        iVar3 = 0;
      }
      else {
        plVar2 = plVar1[-1].predicates;
        plVar1[-1].predicates = (ly_path_predicate *)((long)&plVar2->type + 1);
        puVar6 = (undefined8 *)realloc(&plVar1[-1].predicates,(long)plVar2 * 0x18 + 0x20);
        if (puVar6 != (undefined8 *)0x0) goto LAB_001162c9;
        (*dst)[-1].predicates =
             (ly_path_predicate *)((long)&(*dst)[-1].predicates[-1].field_1 + 0x2f);
LAB_001162d6:
        LVar4 = LY_EMEM;
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_append");
        iVar3 = 5;
      }
      if (iVar3 != 0) {
        if (iVar3 != 5) {
          return LY_EMEM;
        }
        return LVar4;
      }
      plVar1 = *dst;
      plVar2 = plVar1[-1].predicates;
      plVar1[(long)&plVar2[-1].field_1.position + 0x2f].node = (lysc_node *)0x0;
      plVar1[(long)&plVar2[-1].field_1.position + 0x2f].ext = (lysc_ext_instance *)0x0;
      plVar1[(long)&plVar2[-1].field_1.position + 0x2f].predicates = (ly_path_predicate *)0x0;
      plVar1[(long)&plVar2[-1].field_1.position + 0x2f].node = ((ly_path *)(pplVar7 + -2))->node;
      plVar1[(long)&plVar2[-1].field_1.position + 0x2f].ext = (lysc_ext_instance *)pplVar7[-1];
      LVar4 = ly_path_dup_predicates
                        (ctx,*pplVar7,&plVar1[(long)&plVar2[-1].field_1.position + 0x2f].predicates)
      ;
      if (LVar4 != LY_SUCCESS) {
        return LY_EMEM;
      }
      plVar8 = (ly_path_predicate *)((long)&plVar8->type + 1);
      pplVar7 = pplVar7 + 3;
    } while (plVar8 < src[-1].predicates);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ly_path_append(const struct ly_ctx *ctx, const struct ly_path *src, struct ly_path **dst)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u;
    struct ly_path *p;

    if (!src) {
        return LY_SUCCESS;
    }

    LY_ARRAY_CREATE_RET(ctx, *dst, LY_ARRAY_COUNT(src), LY_EMEM);
    LY_ARRAY_FOR(src, u) {
        LY_ARRAY_NEW_GOTO(ctx, *dst, p, ret, cleanup);
        p->node = src[u].node;
        p->ext = src[u].ext;
        LY_CHECK_GOTO(ret = ly_path_dup_predicates(ctx, src[u].predicates, &p->predicates), cleanup);
    }

cleanup:
    return ret;
}